

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

IdList * sqlite3IdListDup(sqlite3 *db,IdList *p)

{
  int iVar1;
  IdList *pIVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  
  if ((p != (IdList *)0x0) &&
     (pIVar2 = (IdList *)sqlite3DbMallocRawNN(db,(long)p->nId << 4 | 8), pIVar2 != (IdList *)0x0)) {
    iVar1 = p->nId;
    pIVar2->nId = iVar1;
    pIVar2->eU4 = p->eU4;
    lVar4 = 0x10;
    for (lVar5 = 0; lVar5 < iVar1; lVar5 = lVar5 + 1) {
      pcVar3 = sqlite3DbStrDup(db,*(char **)((long)(p->a + -1) + lVar4));
      *(char **)((long)(pIVar2->a + -1) + lVar4) = pcVar3;
      *(undefined8 *)((long)pIVar2->a + lVar4 + -8) = *(undefined8 *)((long)p->a + lVar4 + -8);
      iVar1 = p->nId;
      lVar4 = lVar4 + 0x10;
    }
    return pIVar2;
  }
  return (IdList *)0x0;
}

Assistant:

SQLITE_PRIVATE IdList *sqlite3IdListDup(sqlite3 *db, const IdList *p){
  IdList *pNew;
  int i;
  assert( db!=0 );
  if( p==0 ) return 0;
  assert( p->eU4!=EU4_EXPR );
  pNew = sqlite3DbMallocRawNN(db, sizeof(*pNew)+(p->nId-1)*sizeof(p->a[0]) );
  if( pNew==0 ) return 0;
  pNew->nId = p->nId;
  pNew->eU4 = p->eU4;
  for(i=0; i<p->nId; i++){
    struct IdList_item *pNewItem = &pNew->a[i];
    const struct IdList_item *pOldItem = &p->a[i];
    pNewItem->zName = sqlite3DbStrDup(db, pOldItem->zName);
    pNewItem->u4 = pOldItem->u4;
  }
  return pNew;
}